

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O1

void amrex::parser_ast_regvar(parser_node *node,char *name,int i)

{
  ostringstream *this;
  int iVar1;
  Print local_1a8;
  
LAB_0074ec07:
  switch(node->type) {
  case PARSER_NUMBER:
    return;
  case PARSER_SYMBOL:
    iVar1 = strcmp(name,(char *)node->l);
    if (iVar1 != 0) {
      return;
    }
    *(int *)&node->r = i;
    return;
  case PARSER_ADD:
  case PARSER_SUB:
  case PARSER_MUL:
  case PARSER_DIV:
  case PARSER_F2:
  case PARSER_LIST:
    parser_ast_regvar(node->l,name,i);
  case PARSER_ASSIGN:
    node = node->r;
    goto LAB_0074ec07;
  case PARSER_NEG:
  case PARSER_F1:
    node = node->l;
    goto LAB_0074ec07;
  case PARSER_F3:
    goto switchD_0074ec1b_caseD_a;
  case PARSER_ADD_VP:
  case PARSER_SUB_VP:
  case PARSER_MUL_VP:
  case PARSER_DIV_VP:
    parser_ast_regvar(node->r,name,i);
    iVar1 = *(int *)&node->r->r;
    break;
  case PARSER_ADD_PP:
  case PARSER_SUB_PP:
  case PARSER_MUL_PP:
  case PARSER_DIV_PP:
    parser_ast_regvar(node->l,name,i);
    parser_ast_regvar(node->r,name,i);
    (node->lvp).ip = *(int *)&node->l->r;
    iVar1 = *(int *)&node->r->r;
    break;
  case PARSER_NEG_P:
    parser_ast_regvar(node->l,name,i);
    (node->lvp).ip = *(int *)&node->l->r;
    return;
  default:
    local_1a8.os = OutStream();
    this = &local_1a8.ss;
    local_1a8.rank = -1;
    local_1a8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    *(undefined8 *)(&local_1a8.field_0x18 + *(long *)(local_1a8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1a8.os + *(long *)(*(long *)local_1a8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"parser_ast_regvar: unknown node type ",0x25);
    std::ostream::operator<<(this,node->type);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n",1);
    Print::~Print(&local_1a8);
    Abort_host((char *)0x0);
    return;
  }
  node->rip = iVar1;
  return;
switchD_0074ec1b_caseD_a:
  parser_ast_regvar(node->l,name,i);
  parser_ast_regvar(node->r,name,i);
  node = (node->lvp).n;
  goto LAB_0074ec07;
}

Assistant:

void
parser_ast_regvar (struct parser_node* node, char const* name, int i)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
        break;
    case PARSER_SYMBOL:
        if (std::strcmp(name, ((struct parser_symbol*)node)->name) == 0) {
            ((struct parser_symbol*)node)->ip = i;
        }
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_LIST:
        parser_ast_regvar(node->l, name, i);
        parser_ast_regvar(node->r, name, i);
        break;
    case PARSER_NEG:
        parser_ast_regvar(node->l, name, i);
        break;
    case PARSER_F1:
        parser_ast_regvar(((struct parser_f1*)node)->l, name, i);
        break;
    case PARSER_F2:
        parser_ast_regvar(((struct parser_f2*)node)->l, name, i);
        parser_ast_regvar(((struct parser_f2*)node)->r, name, i);
        break;
    case PARSER_F3:
        parser_ast_regvar(((struct parser_f3*)node)->n1, name, i);
        parser_ast_regvar(((struct parser_f3*)node)->n2, name, i);
        parser_ast_regvar(((struct parser_f3*)node)->n3, name, i);
        break;
    case PARSER_ASSIGN:
        parser_ast_regvar(((struct parser_assign*)node)->v, name, i);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        parser_ast_regvar(node->r, name, i);
        node->rip = ((struct parser_symbol*)(node->r))->ip;
        break;
    case PARSER_NEG_P:
        parser_ast_regvar(node->l, name, i);
        node->lvp.ip = ((struct parser_symbol*)(node->l))->ip;
        break;
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
        parser_ast_regvar(node->l, name, i);
        parser_ast_regvar(node->r, name, i);
        node->lvp.ip = ((struct parser_symbol*)(node->l))->ip;
        node->rip = ((struct parser_symbol*)(node->r))->ip;
        break;
    default:
        amrex::AllPrint() << "parser_ast_regvar: unknown node type " << node->type << "\n";
        amrex::Abort();
    }
}